

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.c
# Opt level: O1

int source_segment_mix(mixed_segment *segment)

{
  byte bVar1;
  long *plVar2;
  mixed_pack *pmVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  float *pfVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  float fVar16;
  uint32_t out_frames;
  uint32_t bytes;
  float *target;
  void *pack_data;
  SRC_DATA src_data;
  uint local_a0;
  uint32_t local_9c;
  mixed_pack *local_98;
  float *local_90;
  mixed_transfer_function_from local_88;
  void *local_80;
  SRC_DATA local_78;
  
  plVar2 = (long *)segment->data;
  pmVar3 = (mixed_pack *)*plVar2;
  if (pmVar3->samplerate == *(uint32_t *)(plVar2 + 0xe)) {
    mixed_buffer_from_pack((int)plVar2[0xf],pmVar3,plVar2 + 1,(long)plVar2 + 0x74);
  }
  else {
    local_90 = (float *)(plVar2 + 0x10);
    bVar1 = pmVar3->channels;
    uVar13 = (ulong)bVar1;
    uVar5 = (uint)(0x200 / uVar13);
    bVar4 = mixed_samplesize(pmVar3->encoding);
    uVar6 = (uint)bVar4 * (uint)bVar1;
    local_88 = mixed_translator_from(pmVar3->encoding);
    local_78.end_of_input = 0;
    local_78._52_4_ = 0;
    local_78.input_frames_used = 0;
    local_78.output_frames_gen = 0;
    local_78.input_frames = 0;
    local_78.output_frames = 0;
    local_78.src_ratio = (double)*(uint *)(plVar2 + 0xe) / (double)pmVar3->samplerate;
    local_78.data_in = local_90;
    local_78.data_out = (float *)(plVar2 + 0x110);
    local_98 = pmVar3;
    do {
      pmVar3 = local_98;
      uVar8 = uVar5;
      if (uVar13 != 0) {
        uVar14 = 0;
        do {
          uVar7 = mixed_buffer_available_write((mixed_buffer *)plVar2[uVar14 + 1]);
          if (uVar7 <= uVar8) {
            uVar8 = mixed_buffer_available_write((mixed_buffer *)plVar2[uVar14 + 1]);
          }
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
      }
      local_78.output_frames = (long)uVar8;
      local_9c = 0xffffffff;
      mixed_pack_request_read(&local_80,&local_9c,pmVar3);
      uVar14 = (ulong)local_9c / (ulong)uVar6;
      if (uVar8 < (uint)uVar14) {
        uVar14 = (ulong)uVar8;
      }
      iVar12 = (int)uVar14;
      if (local_80 == (void *)0x0) {
        bVar15 = true;
      }
      else {
        fVar16 = (*local_88)(local_80,local_78.data_in,'\x01',iVar12 * (uint)bVar1,
                             *(float *)((long)plVar2 + 0x74),*(float *)(plVar2 + 0xf));
        *(float *)((long)plVar2 + 0x74) = fVar16;
        local_78.input_frames = uVar14;
        iVar9 = src_process((SRC_STATE *)plVar2[0xd],&local_78);
        bVar15 = iVar9 == 0;
        if (bVar15) {
          iVar12 = (int)local_78.input_frames_used;
          if (uVar13 != 0) {
            uVar14 = 0;
            pfVar11 = local_78.data_out;
            do {
              local_a0 = (uint)local_78.output_frames_gen;
              mixed_buffer_request_write(&local_90,&local_a0,(mixed_buffer *)plVar2[uVar14 + 1]);
              if ((ulong)local_a0 != 0) {
                uVar8 = 0;
                uVar10 = 0;
                do {
                  local_90[uVar10] = pfVar11[uVar8];
                  uVar10 = uVar10 + 1;
                  uVar8 = uVar8 + bVar1;
                } while (local_a0 != uVar10);
              }
              pfVar11 = pfVar11 + 1;
              mixed_buffer_finish_write(local_a0,(mixed_buffer *)plVar2[uVar14 + 1]);
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar13);
          }
          mixed_pack_finish_read(uVar6 * iVar12,local_98);
        }
        else {
          source_segment_mix_cold_1();
        }
      }
      if (!bVar15) {
        return 0;
      }
    } while (iVar12 != 0);
    if (!bVar15) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int source_segment_mix(struct mixed_segment *segment){
  struct pack_segment_data *data = (struct pack_segment_data *)segment->data;
  struct mixed_pack *pack = data->pack;

  if(pack->samplerate == data->samplerate){
    mixed_buffer_from_pack(data->pack, data->buffers, &data->volume, data->target_volume);
  }else{
    void *restrict pack_data;
    float *restrict target = data->resample_in;
    mixed_channel_t channels = pack->channels;
    uint32_t frames, buffer_frames = 512 / channels;
    uint32_t frames_to_bytes = channels * mixed_samplesize(pack->encoding);
    mixed_transfer_function_from decoder = mixed_translator_from(pack->encoding);
    SRC_DATA src_data = {0};
    src_data.src_ratio = ((double)data->samplerate)/((double)pack->samplerate);
    src_data.data_in = target;
    src_data.data_out = data->resample_out;
    do{
      // Step 1: determine available space
      frames = buffer_frames;
      for(mixed_channel_t c=0; c<channels; ++c)
        frames = MIN(frames, mixed_buffer_available_write(data->buffers[c]));
      src_data.output_frames = frames;
      // Step 2: unpack to contiguous floats
      uint32_t bytes = UINT32_MAX;
      mixed_pack_request_read(&pack_data, &bytes, pack);
      frames = MIN(frames, bytes / frames_to_bytes);
      if(pack_data){
        data->volume = decoder(pack_data, (float*)src_data.data_in, 1, frames*channels, data->volume, data->target_volume);
        // Step 3: resample
        src_data.input_frames = frames;
        int e = src_process(data->resample_state, &src_data);
        if(e){
          fprintf(stderr, "libsamplerate: %s\n", src_strerror(e));
          mixed_err(MIXED_RESAMPLE_FAILED);
          return 0;
        }
        // Step 4: transfer from contigous to separate buffers
        frames = src_data.input_frames_used;
        float *restrict source = src_data.data_out;
        for(mixed_channel_t c=0; c<channels; ++c){
          uint32_t out_frames = src_data.output_frames_gen;
          mixed_buffer_request_write(&target, &out_frames, data->buffers[c]);
          for(uint32_t i=0; i<out_frames; ++i)
            target[i] = source[i*channels];
          source++;
          mixed_buffer_finish_write(out_frames, data->buffers[c]);
        }
        // Step 5: update consumed samples
        mixed_pack_finish_read(frames * frames_to_bytes, pack);
      }
    }while(frames);
  }
  return 1;
}